

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_script.cpp
# Opt level: O0

void __thiscall
cfdcapi_script_TapscriptTreeFromWitness_Test::cfdcapi_script_TapscriptTreeFromWitness_Test
          (cfdcapi_script_TapscriptTreeFromWitness_Test *this)

{
  Test *in_RDI;
  
  testing::Test::Test(in_RDI);
  in_RDI->_vptr_Test = (_func_int **)&PTR__cfdcapi_script_TapscriptTreeFromWitness_Test_009f5438;
  return;
}

Assistant:

TEST(cfdcapi_script, TapscriptTreeFromWitness) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* tree_handle = nullptr;
  ret = CfdInitializeTaprootScriptTree(handle, &tree_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    char* internal_pubkey = nullptr;
    ret = CfdSetTapScriptByWitnessStack(handle, tree_handle,
        "c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54",
        "201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac",
        &internal_pubkey);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
        "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
        internal_pubkey);
      CfdFreeStringBuffer(internal_pubkey);
      internal_pubkey = nullptr;
    }

    uint8_t leaf_version = 0;
    char* tapscript = nullptr;
    char* leaf_hash = nullptr;
    ret = CfdGetBaseTapLeaf(handle, tree_handle,
        &leaf_version, &tapscript, &leaf_hash);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_EQ(0xc0, leaf_version);
      EXPECT_STREQ(
        "201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac",
        tapscript);
      EXPECT_STREQ(
        "dfc43ba9fc5f8a9e1b6d6a50600c704bb9e41b741d9ed6de6559a53d2f38e513",
        leaf_hash);
      CfdFreeStringBuffer(tapscript);
      tapscript = nullptr;
      CfdFreeStringBuffer(leaf_hash);
      leaf_hash = nullptr;
    }

    char* witness_program = nullptr;
    char* control_block = nullptr;
    ret = CfdGetTaprootScriptTreeHash(handle, tree_handle,
        "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
        &witness_program,
        &leaf_hash,
        &control_block);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
        "3dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d2",
        witness_program);
      EXPECT_STREQ(
        "dfc43ba9fc5f8a9e1b6d6a50600c704bb9e41b741d9ed6de6559a53d2f38e513",
        leaf_hash);
      EXPECT_STREQ(
        "c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54",
        control_block);
      CfdFreeStringBuffer(witness_program);
      witness_program = nullptr;
      CfdFreeStringBuffer(leaf_hash);
      leaf_hash = nullptr;
      CfdFreeStringBuffer(control_block);
      control_block = nullptr;
    }

    char* tree_str = nullptr;
    ret = CfdGetTaprootScriptTreeSrting(handle, tree_handle, &tree_str);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
        "{{4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d,tl(201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac)},dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54}",
        tree_str);
      CfdFreeStringBuffer(tree_str);
      tree_str = nullptr;
    }

    int tmp_ret = CfdFreeTaprootScriptTreeHandle(handle, tree_handle);
    EXPECT_EQ(kCfdSuccess, tmp_ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}